

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O2

bool __thiscall
diligent_spirv_cross::Parser::variable_storage_is_aliased(Parser *this,SPIRVariable *v)

{
  bool bVar1;
  SPIRType *pSVar2;
  Meta *pMVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  Bitset local_68;
  
  pSVar2 = get<diligent_spirv_cross::SPIRType>(this,*(uint32_t *)&(v->super_IVariant).field_0xc);
  pMVar3 = ParsedIR::find_meta(&this->ir,(ID)(pSVar2->super_IVariant).self.id);
  if (v->storage == StorageBuffer) {
    bVar5 = pSVar2->basetype == Image;
    bVar6 = pSVar2->basetype == AtomicCounter;
LAB_002d8c5d:
    ParsedIR::get_buffer_block_flags(&local_68,&this->ir,v);
    bVar4 = (bool)((byte)((uint)local_68.lower >> 0x13) & 1);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68.higher._M_h);
    bVar1 = true;
  }
  else {
    if (pMVar3 == (Meta *)0x0) {
      bVar5 = pSVar2->basetype == Image;
      bVar6 = pSVar2->basetype == AtomicCounter;
    }
    else {
      bVar5 = pSVar2->basetype == Image;
      bVar6 = pSVar2->basetype == AtomicCounter;
      if (((pMVar3->decoration).decoration_flags.lower & 8) != 0) goto LAB_002d8c5d;
    }
    bVar4 = ParsedIR::has_decoration(&this->ir,(ID)(v->super_IVariant).self.id,DecorationRestrict);
    bVar1 = false;
  }
  bVar5 = (bool)(bVar6 | bVar5);
  if (bVar4 != false) {
    bVar5 = (bool)(bVar4 ^ 1U);
  }
  if (bVar1) {
    bVar5 = (bool)(bVar4 ^ 1U);
  }
  return bVar5;
}

Assistant:

bool Parser::variable_storage_is_aliased(const SPIRVariable &v) const
{
	auto &type = get<SPIRType>(v.basetype);

	auto *type_meta = ir.find_meta(type.self);

	bool ssbo = v.storage == StorageClassStorageBuffer ||
	            (type_meta && type_meta->decoration.decoration_flags.get(DecorationBufferBlock));
	bool image = type.basetype == SPIRType::Image;
	bool counter = type.basetype == SPIRType::AtomicCounter;

	bool is_restrict;
	if (ssbo)
		is_restrict = ir.get_buffer_block_flags(v).get(DecorationRestrict);
	else
		is_restrict = ir.has_decoration(v.self, DecorationRestrict);

	return !is_restrict && (ssbo || image || counter);
}